

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O3

void Aig_ManFreeGlobalBdds(Aig_Man_t *p,DdManager *dd)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = pVVar2->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && (*(DdNode **)((long)pvVar1 + 0x28) != (DdNode *)0x0)) {
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x28));
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
        pVVar2 = p->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Aig_ManFreeGlobalBdds( Aig_Man_t * p, DdManager * dd ) 
{ 
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjGlobalBdd(pObj) )
            Aig_ObjCleanGlobalBdd( dd, pObj );
}